

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Type> *
wasm::WATParser::tupletype<wasm::WATParser::ParseImplicitTypeDefsCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseImplicitTypeDefsCtx *ctx)

{
  undefined1 uVar1;
  bool bVar2;
  string_view expected;
  string local_100 [32];
  undefined1 local_e0 [8];
  Result<wasm::Type> _val;
  undefined1 auStack_98 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  undefined1 local_78 [8];
  Result<wasm::Type> elem;
  ulong local_48;
  
  elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &ctx->in;
  expected._M_str = "tuple";
  expected._M_len = 5;
  bVar2 = Lexer::takeSExprStart
                    ((Lexer *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,expected);
  if (bVar2) {
    auStack_98 = (undefined1  [8])0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48 = 0;
    do {
      bVar2 = Lexer::takeRParen((Lexer *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_)
      ;
      if (bVar2) {
        if (local_48 < 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     "tuples must have at least two elements",(allocator<char> *)local_e0);
          Lexer::err((Err *)local_78,
                     (Lexer *)elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                     (string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err> *)
                     __return_storage_ptr__,local_78);
          std::__cxx11::string::~string((string *)local_78);
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        }
        else {
          TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::makeTupleType
                    ((Result<wasm::Type> *)local_78,
                     &ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98);
          MaybeResult<wasm::Type>::MaybeResult<wasm::Type>
                    (__return_storage_ptr__,(Result<wasm::Type> *)local_78);
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_78);
        }
        break;
      }
      singlevaltype<wasm::WATParser::ParseImplicitTypeDefsCtx>((Result<wasm::Type> *)local_78,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_e0,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_78);
      uVar1 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string(local_100,(string *)local_e0);
        std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err> *)__return_storage_ptr__
                   ,local_100);
        std::__cxx11::string::~string(local_100);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_e0);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_e0);
        TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>::appendTupleElem
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98,(Type)local_78);
        local_48 = local_48 + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_78);
    } while (uVar1 != '\x01');
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> tupletype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("tuple"sv)) {
    return {};
  }
  auto elems = ctx.makeTupleElemList();
  size_t numElems = 0;
  while (!ctx.in.takeRParen()) {
    auto elem = singlevaltype(ctx);
    CHECK_ERR(elem);
    ctx.appendTupleElem(elems, *elem);
    ++numElems;
  }
  if (numElems < 2) {
    return ctx.in.err("tuples must have at least two elements");
  }
  return ctx.makeTupleType(elems);
}